

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedPtrField<CoreML::Specification::ItemSimilarityRecommender_ConnectedItem>::
InternalSwap(RepeatedPtrField<CoreML::Specification::ItemSimilarityRecommender_ConnectedItem> *this,
            RepeatedPtrField<CoreML::Specification::ItemSimilarityRecommender_ConnectedItem> *other)

{
  RepeatedPtrField<CoreML::Specification::ItemSimilarityRecommender_ConnectedItem> *other_local;
  RepeatedPtrField<CoreML::Specification::ItemSimilarityRecommender_ConnectedItem> *this_local;
  
  internal::RepeatedPtrFieldBase::InternalSwap
            (&this->super_RepeatedPtrFieldBase,&other->super_RepeatedPtrFieldBase);
  return;
}

Assistant:

void InternalSwap(RepeatedPtrField* other) {
    internal::RepeatedPtrFieldBase::InternalSwap(other);
  }